

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall
Rml::Context::Context
          (Context *this,String *name,RenderManager *render_manager,
          TextInputHandler *text_input_handler)

{
  String *instancer_name;
  ElementPtr *this_00;
  size_t *psVar1;
  Element *this_01;
  code *pcVar2;
  undefined8 __p;
  _Head_base<0UL,_Rml::Element_*,_false> __p_00;
  _Alloc_hider __p_01;
  bool bVar3;
  ElementDocument *this_02;
  allocator<char> local_10a;
  allocator<char> local_109;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [4];
  UniquePtr<ScrollController> *local_b0;
  vector<Rml::Element*,std::allocator<Rml::Element*>> *local_a8;
  String *local_78;
  _Head_base<0UL,_Rml::Element_*,_false> local_70;
  String local_68;
  XMLAttributes local_48;
  
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__Context_00396058;
  ::std::__cxx11::string::string((string *)&this->name,(string *)name);
  (this->dimensions).x = 0;
  (this->dimensions).y = 0;
  this->density_independent_pixel_ratio = 1.0;
  instancer_name = &this->documents_base_tag;
  local_78 = &this->name;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)instancer_name,"body",(allocator<char> *)local_108);
  this->render_manager = render_manager;
  (this->active_themes).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->active_themes).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->active_themes).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = (vector<Rml::Element*,std::allocator<Rml::Element*>> *)&this->document_focus_history;
  (this->scroll_controller)._M_t.
  super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>._M_t.
  super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>.
  super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl = (ScrollController *)0x0;
  this_00 = &this->root;
  (this->hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->document_focus_history).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->document_focus_history).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->document_focus_history).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unloaded_documents).
  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unloaded_documents).
  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unloaded_documents).
  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)0x0;
  (this->last_click_mouse_position).x = 0;
  (this->last_click_mouse_position).y = 0;
  (this->mouse_position).x = 0;
  (this->mouse_position).y = 0;
  (this->cursor_name)._M_dataplus._M_p = (pointer)&(this->cursor_name).field_2;
  (this->cursor_name)._M_string_length = 0;
  (this->cursor_name).field_2._M_local_buf[0] = '\0';
  (this->cursor_proxy)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)0x0;
  local_b0 = &this->scroll_controller;
  (this->drag_hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->drag_hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->drag_hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar1 = &(this->data_models).mMask;
  (this->data_models).mKeyVals = (Node *)psVar1;
  (this->data_models).mInfo = (uint8_t *)psVar1;
  (this->data_models).mNumElements = 0;
  (this->data_models).mMask = 0;
  (this->data_models).mMaxNumElementsAllowed = 0;
  (this->data_models).mInfoInc = 0x20;
  (this->data_models).mInfoHashShift = 0;
  (this->default_data_type_register)._M_t.
  super___uniq_ptr_impl<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>._M_t.
  super__Tuple_impl<0UL,_Rml::DataTypeRegister_*,_std::default_delete<Rml::DataTypeRegister>_>.
  super__Head_base<0UL,_Rml::DataTypeRegister_*,_false>._M_head_impl = (DataTypeRegister *)0x0;
  this->text_input_handler = text_input_handler;
  this->next_update_timeout = 0.0;
  this->instancer = (ContextInstancer *)0x0;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"*",&local_109);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"#root",&local_10a);
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Factory::InstanceElement
            ((Factory *)&local_70,(Element *)0x0,(String *)local_108,&local_68,&local_48);
  __p_00._M_head_impl = local_70._M_head_impl;
  local_70._M_head_impl = (Element *)0x0;
  ::std::__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>::reset
            ((__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this_00,
             __p_00._M_head_impl);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
            ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&local_70);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_48.m_container);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)local_108);
  Element::SetId((this_00->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                 _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,name);
  Element::SetOffset((this_00->_M_t).
                     super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                     super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                     super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,(Vector2f)0x0,
                     (Element *)0x0,false);
  this_01 = (this_00->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
            super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
            super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  Property::Property<int>((Property *)local_108,0,NUMBER,-1);
  Element::SetProperty(this_01,ZIndex,(Property *)local_108);
  Property::~Property((Property *)local_108);
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (pointer)0x0;
  local_f8[0]._M_allocated_capacity = 0;
  Factory::InstanceElement
            ((Factory *)&local_68,(Element *)0x0,instancer_name,instancer_name,
             (XMLAttributes *)local_108);
  __p_01._M_p = local_68._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)0x0;
  ::std::__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>::reset
            ((__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&this->cursor_proxy,
             (pointer)__p_01._M_p);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
            ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&local_68);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
             *)local_108);
  this_02 = rmlui_dynamic_cast<Rml::ElementDocument*,Rml::Element*>
                      ((this->cursor_proxy)._M_t.
                       super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
  if (this_02 == (ElementDocument *)0x0) {
    bVar3 = Assert("RMLUI_ASSERT(cursor_proxy_document)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Context.cpp"
                   ,0x45);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  this_02->context = this;
  Property::Property<Rml::Colour<unsigned_char,255,false>>
            ((Property *)local_108,(Colour<unsigned_char,_255,_false>)0xffffff,COLOUR,-1);
  Element::SetProperty(&this_02->super_Element,BackgroundColor,(Property *)local_108);
  Property::~Property((Property *)local_108);
  Property::Property<int>((Property *)local_108,0,PX,-1);
  Element::SetProperty(&this_02->super_Element,BorderTopWidth,(Property *)local_108);
  Property::~Property((Property *)local_108);
  Property::Property<int>((Property *)local_108,0,PX,-1);
  Element::SetProperty(&this_02->super_Element,BorderRightWidth,(Property *)local_108);
  Property::~Property((Property *)local_108);
  Property::Property<int>((Property *)local_108,0,PX,-1);
  Element::SetProperty(&this_02->super_Element,BorderBottomWidth,(Property *)local_108);
  Property::~Property((Property *)local_108);
  Property::Property<int>((Property *)local_108,0,PX,-1);
  Element::SetProperty(&this_02->super_Element,BorderLeftWidth,(Property *)local_108);
  Property::~Property((Property *)local_108);
  Property::Property((Property *)local_108);
  Element::SetProperty(&this_02->super_Element,Decorator,(Property *)local_108);
  Property::~Property((Property *)local_108);
  Property::Property<Rml::Style::Overflow,Rml::Style::Overflow>((Property *)local_108,Visible);
  Element::SetProperty(&this_02->super_Element,OverflowX,(Property *)local_108);
  Property::~Property((Property *)local_108);
  Property::Property<Rml::Style::Overflow,Rml::Style::Overflow>((Property *)local_108,Visible);
  Element::SetProperty(&this_02->super_Element,OverflowY,(Property *)local_108);
  Property::~Property((Property *)local_108);
  local_108._0_8_ =
       (this_00->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  ::std::vector<Rml::Element*,std::allocator<Rml::Element*>>::emplace_back<Rml::Element*>
            (local_a8,(Element **)local_108);
  this->focus = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  this->drag = (Element *)0x0;
  this->drag_started = false;
  this->drag_verbose = false;
  this->mouse_active = false;
  this->hover = (Element *)0x0;
  this->active = (Element *)0x0;
  this->last_click_element = (Element *)0x0;
  this->last_click_time = 0.0;
  this->drag_clone = (Element *)0x0;
  this->drag_hover = (Element *)0x0;
  this->enable_cursor = true;
  ::std::make_unique<Rml::ScrollController>();
  __p = local_108._0_8_;
  local_108._0_8_ = (pointer)0x0;
  ::std::__uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::reset
            ((__uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_> *)
             local_b0,(pointer)__p);
  ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::~unique_ptr
            ((unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_> *)
             local_108);
  return;
}

Assistant:

Context::Context(const String& name, RenderManager* render_manager, TextInputHandler* text_input_handler) :
	name(name), render_manager(render_manager), text_input_handler(text_input_handler)
{
	instancer = nullptr;

	root = Factory::InstanceElement(nullptr, "*", "#root", XMLAttributes());
	root->SetId(name);
	root->SetOffset(Vector2f(0, 0), nullptr);
	root->SetProperty(PropertyId::ZIndex, Property(0, Unit::NUMBER));

	cursor_proxy = Factory::InstanceElement(nullptr, documents_base_tag, documents_base_tag, XMLAttributes());
	ElementDocument* cursor_proxy_document = rmlui_dynamic_cast<ElementDocument*>(cursor_proxy.get());
	RMLUI_ASSERT(cursor_proxy_document);
	cursor_proxy_document->context = this;

	// The cursor proxy takes the style from its cloned element's document. The latter may define style rules for `<body>` which we don't want on the
	// proxy. Thus, we override some properties here that we in particular don't want to inherit from the client document, especially those that
	// result in decoration of the body element.
	cursor_proxy_document->SetProperty(PropertyId::BackgroundColor, Property(Colourb(255, 255, 255, 0), Unit::COLOUR));
	cursor_proxy_document->SetProperty(PropertyId::BorderTopWidth, Property(0, Unit::PX));
	cursor_proxy_document->SetProperty(PropertyId::BorderRightWidth, Property(0, Unit::PX));
	cursor_proxy_document->SetProperty(PropertyId::BorderBottomWidth, Property(0, Unit::PX));
	cursor_proxy_document->SetProperty(PropertyId::BorderLeftWidth, Property(0, Unit::PX));
	cursor_proxy_document->SetProperty(PropertyId::Decorator, Property());
	cursor_proxy_document->SetProperty(PropertyId::OverflowX, Property(Style::Overflow::Visible));
	cursor_proxy_document->SetProperty(PropertyId::OverflowY, Property(Style::Overflow::Visible));

	document_focus_history.push_back(root.get());
	focus = root.get();
	hover = nullptr;
	active = nullptr;
	drag = nullptr;

	drag_started = false;
	drag_verbose = false;
	drag_clone = nullptr;
	drag_hover = nullptr;
	last_click_element = nullptr;
	last_click_time = 0;

	mouse_active = false;
	enable_cursor = true;

	scroll_controller = MakeUnique<ScrollController>();
}